

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O3

UResourceBundle *
init_resb_result(ResourceData *rdata,Resource r,char *key,int32_t idx,UResourceDataEntry *realData,
                UResourceBundle *parent,int32_t noAlias,UResourceBundle *resB,UErrorCode *status)

{
  char cVar1;
  int32_t *piVar2;
  uint16_t *puVar3;
  uint16_t *puVar4;
  int32_t iVar5;
  UBool UVar6;
  UBool UVar7;
  UBool UVar8;
  UBool UVar9;
  undefined4 uVar10;
  int32_t iVar11;
  uint uVar12;
  int32_t iVar13;
  int iVar14;
  Resource RVar15;
  UChar *us;
  size_t sVar16;
  long lVar17;
  char *pcVar18;
  UResourceBundle *resB_00;
  char *pcVar19;
  uint length;
  UResourceDataEntry *realData_00;
  UResourceBundle *parent_00;
  char *pcVar20;
  char *local_240;
  int32_t len;
  UResourceBundle *local_230;
  char *temp;
  char *local_220;
  ulong local_218;
  char *myPath;
  ulong local_208;
  UErrorCode intStatus;
  char stackPath [256];
  char stackAlias [200];
  
  if (U_ZERO_ERROR < *status) {
    return resB;
  }
  if (parent == (UResourceBundle *)0x0) {
    *status = U_ILLEGAL_ARGUMENT_ERROR;
    return (UResourceBundle *)0x0;
  }
  if ((r & 0xf0000000) == 0x30000000) {
    local_218 = (ulong)(uint)noAlias;
    if (0xff < noAlias) {
      *status = U_TOO_MANY_ALIASES_ERROR;
      return resB;
    }
    len = 0;
    local_230 = (UResourceBundle *)key;
    us = res_getAlias_63(rdata,r,&len);
    if (len < 1) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
      return resB;
    }
    length = len + 1;
    len = length;
    if (parent->fResPath == (char *)0x0) {
      uVar12 = 0;
    }
    else {
      sVar16 = strlen(parent->fResPath);
      uVar12 = (int)sVar16 + 1;
    }
    if ((int)uVar12 <= (int)length) {
      uVar12 = length;
    }
    local_208 = (ulong)uVar12;
    if (uVar12 < 0xc9) {
      pcVar19 = stackAlias;
      local_208 = 200;
    }
    else {
      pcVar19 = (char *)uprv_malloc_63(local_208);
      length = len;
      if (pcVar19 == (char *)0x0) goto LAB_001c5216;
    }
    u_UCharsToChars_63(us,pcVar19,length);
    local_220 = pcVar19;
    if (*pcVar19 == '/') {
      pcVar20 = pcVar19 + 1;
      local_240 = strchr(pcVar20,0x2f);
      if (local_240 == (char *)0x0) {
        sVar16 = strlen(pcVar19);
        local_240 = pcVar19 + sVar16;
      }
      else {
        *local_240 = '\0';
        local_240 = local_240 + 1;
      }
      iVar14 = strcmp(pcVar20,"LOCALE");
      if (iVar14 == 0) {
        pcVar20 = realData->fPath;
        pcVar19 = parent->fTopLevelData->fName;
      }
      else {
        iVar14 = strcmp(pcVar20,"ICUDATA");
        if (iVar14 == 0) {
          pcVar20 = (char *)0x0;
        }
        pcVar18 = strchr(local_240,0x2f);
        pcVar19 = local_240;
        if (pcVar18 == (char *)0x0) {
          local_240 = (char *)0x0;
        }
        else {
          *pcVar18 = '\0';
          local_240 = pcVar18 + 1;
        }
      }
    }
    else {
      local_240 = strchr(pcVar19,0x2f);
      if (local_240 == (char *)0x0) {
        local_240 = (char *)0x0;
      }
      else {
        *local_240 = '\0';
        local_240 = local_240 + 1;
      }
      pcVar20 = realData->fPath;
      pcVar19 = local_220;
    }
    temp = (char *)0x0;
    intStatus = U_ZERO_ERROR;
    resB_00 = ures_openWithType((UResourceBundle *)0x0,pcVar20,pcVar19,URES_OPEN_DIRECT,&intStatus);
    pcVar19 = local_220;
    if (intStatus < U_ILLEGAL_ARGUMENT_ERROR) {
      if (local_240 == (char *)0x0) {
        stackPath._0_8_ = parent->fResPath;
        if ((char *)stackPath._0_8_ == (char *)0x0) {
          RVar15 = resB_00->fRes;
          stackPath[0] = '\0';
          stackPath[1] = '\0';
          stackPath[2] = '\0';
          stackPath[3] = '\0';
          stackPath[4] = '\0';
          stackPath[5] = '\0';
          stackPath[6] = '\0';
          stackPath[7] = '\0';
        }
        else {
          strcpy(local_220,(char *)stackPath._0_8_);
          stackPath._0_8_ = pcVar19;
          RVar15 = res_findResource_63(&resB_00->fResData,resB_00->fRes,(char **)stackPath,&temp);
        }
        if (local_230 == (UResourceBundle *)0x0) {
          if (idx != -1) {
            if ((RVar15 & 0xf0000000) == 0x20000000 || (RVar15 & 0xe0000000) == 0x40000000) {
              RVar15 = res_getTableItemByIndex_63(&resB_00->fResData,RVar15,idx,(char **)stackPath);
            }
            else {
              RVar15 = res_getArrayItem_63(&resB_00->fResData,RVar15,idx);
            }
          }
        }
        else {
          sVar16 = strlen((char *)local_230);
          len = (int)sVar16 + 1;
          if ((int)local_208 < len) {
            if (pcVar19 == stackAlias) {
              pcVar19 = (char *)uprv_malloc_63((ulong)(uint)len);
            }
            else {
              pcVar19 = (char *)uprv_realloc_63(pcVar19,(ulong)(uint)len);
            }
            if (pcVar19 == (char *)0x0) {
              ures_closeBundle(resB_00,'\x01');
              *status = U_MEMORY_ALLOCATION_ERROR;
              return (UResourceBundle *)0x0;
            }
          }
          memcpy(pcVar19,local_230,(long)len);
          stackPath._0_8_ = pcVar19;
          RVar15 = res_findResource_63(&resB_00->fResData,RVar15,(char **)stackPath,&temp);
        }
        if (RVar15 == 0xffffffff) {
          *status = U_MISSING_RESOURCE_ERROR;
        }
        else {
          resB = init_resb_result(&resB_00->fResData,RVar15,temp,-1,resB_00->fData,resB_00,
                                  noAlias + 1,resB,status);
        }
      }
      else {
        realData_00 = resB_00->fData;
        local_230 = resB_00;
        myPath = stackPath;
        sVar16 = strlen(local_240);
        pcVar20 = stackPath;
        if ((0x100 < sVar16) &&
           (pcVar20 = (char *)uprv_malloc_63(sVar16 + 1), pcVar20 == (char *)0x0)) {
          *status = U_MEMORY_ALLOCATION_ERROR;
          ures_closeBundle(local_230,'\x01');
          return (UResourceBundle *)0x0;
        }
        strcpy(pcVar20,local_240);
        local_218 = (ulong)((int)local_218 + 1);
        parent_00 = local_230;
        pcVar18 = stackPath;
        do {
          RVar15 = (realData_00->fData).rootRes;
          if (*pcVar18 != '\0') {
            do {
              if (U_ZERO_ERROR < *status) break;
              RVar15 = res_findResource_63(&realData_00->fData,RVar15,&myPath,&temp);
              if (RVar15 == 0xffffffff) {
                RVar15 = 0xffffffff;
                break;
              }
              resB = init_resb_result(&realData_00->fData,RVar15,temp,-1,realData_00,parent_00,
                                      (int32_t)local_218,resB,status);
              if (resB != (UResourceBundle *)0x0) {
                RVar15 = resB->fRes;
                realData_00 = resB->fData;
              }
              parent_00 = resB;
            } while (*myPath != '\0');
          }
          realData_00 = realData_00->fParent;
          strcpy(pcVar20,local_240);
          pcVar19 = local_220;
          resB_00 = local_230;
          myPath = pcVar20;
        } while ((RVar15 == 0xffffffff) &&
                (pcVar18 = pcVar20, realData_00 != (UResourceDataEntry *)0x0));
        if (RVar15 == 0xffffffff) {
          *status = U_MISSING_RESOURCE_ERROR;
          parent_00 = resB;
        }
        resB = parent_00;
        if (pcVar20 != stackPath) {
          uprv_free_63(pcVar20);
        }
      }
    }
    else {
      *status = intStatus;
    }
    if (pcVar19 != stackAlias) {
      uprv_free_63(pcVar19);
    }
    if (resB_00 != resB) {
      ures_closeBundle(resB_00,'\x01');
      return resB;
    }
    return resB;
  }
  if (resB == (UResourceBundle *)0x0) {
    resB = (UResourceBundle *)uprv_malloc_63(200);
    if (resB == (UResourceBundle *)0x0) {
LAB_001c5216:
      *status = U_MEMORY_ALLOCATION_ERROR;
      return (UResourceBundle *)0x0;
    }
    resB->fMagic1 = 0x12c9b17;
    resB->fMagic2 = 0x12bb38b;
LAB_001c500b:
    resB->fResPath = (char *)0x0;
    resB->fResPathLen = 0;
  }
  else {
    if (resB->fData != (UResourceDataEntry *)0x0) {
      entryClose(resB->fData);
    }
    if (resB->fVersion != (char *)0x0) {
      uprv_free_63(resB->fVersion);
    }
    if (parent != resB) {
      pcVar19 = resB->fResPath;
      if (pcVar19 != resB->fResBuf && pcVar19 != (char *)0x0) {
        uprv_free_63(pcVar19);
      }
      goto LAB_001c500b;
    }
  }
  resB->fData = realData;
  entryIncrease(realData);
  resB->fHasFallback = '\0';
  resB->fIsTopLevel = '\0';
  resB->fIndex = -1;
  resB->fKey = key;
  resB->fTopLevelData = parent->fTopLevelData;
  if (resB != parent && parent->fResPath != (char *)0x0) {
    ures_appendResPath(resB,parent->fResPath,parent->fResPathLen,status);
  }
  if (key == (char *)0x0) {
    if (idx < 0) goto LAB_001c5117;
    iVar13 = T_CString_integerToString_63(stackPath,idx,10);
    ures_appendResPath(resB,stackPath,iVar13,status);
    cVar1 = resB->fResPath[(long)resB->fResPathLen + -1];
  }
  else {
    sVar16 = strlen(key);
    ures_appendResPath(resB,key,(int32_t)sVar16,status);
    cVar1 = resB->fResPath[(long)resB->fResPathLen + -1];
  }
  if (cVar1 != '/') {
    ures_appendResPath(resB,"/",1,status);
  }
LAB_001c5117:
  if (resB->fResBuf == resB->fResPath) {
    lVar17 = (long)resB->fResPathLen;
  }
  else {
    lVar17 = 0;
  }
  memset(resB->fResBuf + lVar17,0,0x40 - lVar17);
  resB->fVersion = (char *)0x0;
  resB->fRes = r;
  piVar2 = rdata->pRoot;
  puVar3 = rdata->p16BitUnits;
  pcVar19 = rdata->poolBundleKeys;
  RVar15 = rdata->rootRes;
  iVar11 = rdata->localKeyLimit;
  puVar4 = rdata->poolBundleStrings;
  iVar13 = rdata->poolStringIndexLimit;
  iVar5 = rdata->poolStringIndex16Limit;
  UVar6 = rdata->noFallback;
  UVar7 = rdata->isPoolBundle;
  UVar8 = rdata->usesPoolBundle;
  UVar9 = rdata->useNativeStrcmp;
  uVar10 = *(undefined4 *)&rdata->field_0x3c;
  (resB->fResData).data = rdata->data;
  (resB->fResData).pRoot = piVar2;
  (resB->fResData).poolStringIndexLimit = iVar13;
  (resB->fResData).poolStringIndex16Limit = iVar5;
  (resB->fResData).noFallback = UVar6;
  (resB->fResData).isPoolBundle = UVar7;
  (resB->fResData).usesPoolBundle = UVar8;
  (resB->fResData).useNativeStrcmp = UVar9;
  *(undefined4 *)&(resB->fResData).field_0x3c = uVar10;
  (resB->fResData).rootRes = RVar15;
  (resB->fResData).localKeyLimit = iVar11;
  (resB->fResData).poolBundleStrings = puVar4;
  (resB->fResData).p16BitUnits = puVar3;
  (resB->fResData).poolBundleKeys = pcVar19;
  iVar13 = res_countArrayItems_63(&resB->fResData,r);
  resB->fSize = iVar13;
  return resB;
}

Assistant:

static UResourceBundle *init_resb_result(const ResourceData *rdata, Resource r, 
                                         const char *key, int32_t idx, UResourceDataEntry *realData, 
                                         const UResourceBundle *parent, int32_t noAlias,
                                         UResourceBundle *resB, UErrorCode *status) 
{
    if(status == NULL || U_FAILURE(*status)) {
        return resB;
    }
    if (parent == NULL) {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return NULL;
    }
    if(RES_GET_TYPE(r) == URES_ALIAS) { /* This is an alias, need to exchange with real data */
        if(noAlias < URES_MAX_ALIAS_LEVEL) { 
            int32_t len = 0;
            const UChar *alias = res_getAlias(rdata, r, &len); 
            if(len > 0) {
                /* we have an alias, now let's cut it up */
                char stackAlias[200];
                char *chAlias = NULL, *path = NULL, *locale = NULL, *keyPath = NULL;
                int32_t capacity;

                /*
                * Allocate enough space for both the char * version
                * of the alias and parent->fResPath.
                *
                * We do this so that res_findResource() can modify the path,
                * which allows us to remove redundant _res_findResource() variants
                * in uresdata.c.
                * res_findResource() now NUL-terminates each segment so that table keys
                * can always be compared with strcmp() instead of strncmp().
                * Saves code there and simplifies testing and code coverage.
                *
                * markus 2003oct17
                */
                ++len; /* count the terminating NUL */
                if(parent->fResPath != NULL) {
                    capacity = (int32_t)uprv_strlen(parent->fResPath) + 1;
                } else {
                    capacity = 0;
                }
                if(capacity < len) {
                    capacity = len;
                }
                if(capacity <= (int32_t)sizeof(stackAlias)) {
                    capacity = (int32_t)sizeof(stackAlias);
                    chAlias = stackAlias;
                } else {
                    chAlias = (char *)uprv_malloc(capacity);
                    /* test for NULL */
                    if(chAlias == NULL) {
                        *status = U_MEMORY_ALLOCATION_ERROR;
                        return NULL;
                    }
                }
                u_UCharsToChars(alias, chAlias, len);

                if(*chAlias == RES_PATH_SEPARATOR) {
                    /* there is a path included */
                    locale = uprv_strchr(chAlias+1, RES_PATH_SEPARATOR);
                    if(locale == NULL) {
                        locale = uprv_strchr(chAlias, 0); /* avoid locale == NULL to make code below work */
                    } else {
                        *locale = 0;
                        locale++;
                    }
                    path = chAlias+1;
                    if(uprv_strcmp(path, "LOCALE") == 0) {
                        /* this is an XPath alias, starting with "/LOCALE/" */
                        /* it contains the path to a resource which should be looked up */
                        /* starting in the requested locale */
                        keyPath = locale; 
                        locale = parent->fTopLevelData->fName; /* this is the requested locale's name */
                        path = realData->fPath; /* we will be looking in the same package */
                    } else {
                        if(uprv_strcmp(path, "ICUDATA") == 0) { /* want ICU data */
                            path = NULL;
                        }
                        keyPath = uprv_strchr(locale, RES_PATH_SEPARATOR);
                        if(keyPath) {
                            *keyPath = 0;
                            keyPath++;
                        }
                    }
                } else {
                    /* no path, start with a locale */
                    locale = chAlias;
                    keyPath = uprv_strchr(locale, RES_PATH_SEPARATOR);
                    if(keyPath) {
                        *keyPath = 0;
                        keyPath++;
                    }
                    path = realData->fPath;
                }


                {
                    /* got almost everything, let's try to open */
                    /* first, open the bundle with real data */
                    UResourceBundle *result = resB;
                    const char* temp = NULL;
                    UErrorCode intStatus = U_ZERO_ERROR;
                    UResourceBundle *mainRes = ures_openDirect(path, locale, &intStatus); 
                    if(U_SUCCESS(intStatus)) {
                        if(keyPath == NULL) {
                            /* no key path. This means that we are going to 
                            * to use the corresponding resource from
                            * another bundle
                            */
                            /* first, we are going to get a corresponding parent 
                            * resource to the one we are searching.
                            */
                            char *aKey = parent->fResPath;
                            if(aKey) {
                                uprv_strcpy(chAlias, aKey); /* allocated large enough above */
                                aKey = chAlias;
                                r = res_findResource(&(mainRes->fResData), mainRes->fRes, &aKey, &temp);
                            } else {
                                r = mainRes->fRes;
                            }
                            if(key) {
                                /* we need to make keyPath from parent's fResPath and
                                * current key, if there is a key associated
                                */
                                len = (int32_t)(uprv_strlen(key) + 1);
                                if(len > capacity) {
                                    capacity = len;
                                    if(chAlias == stackAlias) {
                                        chAlias = (char *)uprv_malloc(capacity);
                                    } else {
                                        chAlias = (char *)uprv_realloc(chAlias, capacity);
                                    }
                                    if(chAlias == NULL) {
                                        ures_close(mainRes);
                                        *status = U_MEMORY_ALLOCATION_ERROR;
                                        return NULL;
                                    }
                                }
                                uprv_memcpy(chAlias, key, len);
                                aKey = chAlias;
                                r = res_findResource(&(mainRes->fResData), r, &aKey, &temp);
                            } else if(idx != -1) {
                                /* if there is no key, but there is an index, try to get by the index */
                                /* here we have either a table or an array, so get the element */
                                int32_t type = RES_GET_TYPE(r);
                                if(URES_IS_TABLE(type)) {
                                    r = res_getTableItemByIndex(&(mainRes->fResData), r, idx, (const char **)&aKey);
                                } else { /* array */
                                    r = res_getArrayItem(&(mainRes->fResData), r, idx);
                                }
                            }
                            if(r != RES_BOGUS) {
                                result = init_resb_result(&(mainRes->fResData), r, temp, -1, mainRes->fData, mainRes, noAlias+1, resB, status);
                            } else {
                                *status = U_MISSING_RESOURCE_ERROR;
                                result = resB;
                            }
                        } else {
                            /* this one is a bit trickier. 
                            * we start finding keys, but after we resolve one alias, the path might continue.
                            * Consider: 
                            *     aliastest:alias { "testtypes/anotheralias/Sequence" }
                            *     anotheralias:alias { "/ICUDATA/sh/CollationElements" }
                            * aliastest resource should finally have the sequence, not collation elements.
                            */
                            UResourceDataEntry *dataEntry = mainRes->fData;
                            char stackPath[URES_MAX_BUFFER_SIZE];
                            char *pathBuf = stackPath, *myPath = pathBuf;
                            if(uprv_strlen(keyPath) > URES_MAX_BUFFER_SIZE) {
                                pathBuf = (char *)uprv_malloc((uprv_strlen(keyPath)+1)*sizeof(char));
                                if(pathBuf == NULL) {
                                    *status = U_MEMORY_ALLOCATION_ERROR;
                                    ures_close(mainRes);
                                    return NULL;
                                }
                            }
                            uprv_strcpy(pathBuf, keyPath);
                            result = mainRes;
                            /* now we have fallback following here */
                            do {
                                r = dataEntry->fData.rootRes;     
                                /* this loop handles 'found' resources over several levels */
                                while(*myPath && U_SUCCESS(*status)) {
                                    r = res_findResource(&(dataEntry->fData), r, &myPath, &temp);
                                    if(r != RES_BOGUS) { /* found a resource, but it might be an indirection */
                                        resB = init_resb_result(&(dataEntry->fData), r, temp, -1, dataEntry, result, noAlias+1, resB, status);
                                        result = resB;
                                        if(result) {
                                            r = result->fRes; /* switch to a new resource, possibly a new tree */
                                            dataEntry = result->fData;
                                        }
                                    } else { /* no resource found, we don't really want to look anymore on this level */
                                        break;
                                    }
                                }
                                dataEntry = dataEntry->fParent;
                                uprv_strcpy(pathBuf, keyPath);
                                myPath = pathBuf;
                            } while(r == RES_BOGUS && dataEntry != NULL);
                            if(r == RES_BOGUS) {
                                *status = U_MISSING_RESOURCE_ERROR;
                                result = resB;
                            }
                            if(pathBuf != stackPath) {
                                uprv_free(pathBuf);
                            }
                        }
                    } else { /* we failed to open the resource we're aliasing to */
                        *status = intStatus;
                    }
                    if(chAlias != stackAlias) {
                        uprv_free(chAlias);
                    }
                    if(mainRes != result) {
                        ures_close(mainRes);
                    }
                    return result;
                }
            } else {
                /* bad alias, should be an error */ 
                *status = U_ILLEGAL_ARGUMENT_ERROR;
                return resB;
            }
        } else {
            *status = U_TOO_MANY_ALIASES_ERROR;
            return resB;
        }
    }
    if(resB == NULL) {
        resB = (UResourceBundle *)uprv_malloc(sizeof(UResourceBundle));
        /* test for NULL */
        if (resB == NULL) {
            *status = U_MEMORY_ALLOCATION_ERROR;
            return NULL;
        }
        ures_setIsStackObject(resB, FALSE);
        resB->fResPath = NULL;
        resB->fResPathLen = 0;
    } else {
        if(resB->fData != NULL) {
            entryClose(resB->fData);
        }
        if(resB->fVersion != NULL) {
            uprv_free(resB->fVersion);
        }
        /* 
        weiv: if stack object was passed in, it doesn't really need to be reinited,
        since the purpose of initing is to remove stack junk. However, at this point 
        we would not do anything to an allocated object, so stack object should be
        treated the same
        */
        /*
        if(ures_isStackObject(resB) != FALSE) {
        ures_initStackObject(resB);
        }
        */
        if(parent != resB) {
            ures_freeResPath(resB);
        }
    }
    resB->fData = realData;
    entryIncrease(resB->fData);
    resB->fHasFallback = FALSE;
    resB->fIsTopLevel = FALSE;
    resB->fIndex = -1;
    resB->fKey = key; 
    /*resB->fParentRes = parent;*/
    resB->fTopLevelData = parent->fTopLevelData;
    if(parent->fResPath && parent != resB) {
        ures_appendResPath(resB, parent->fResPath, parent->fResPathLen, status);
    }
    if(key != NULL) {
        ures_appendResPath(resB, key, (int32_t)uprv_strlen(key), status);
        if(resB->fResPath[resB->fResPathLen-1] != RES_PATH_SEPARATOR) {
            ures_appendResPath(resB, RES_PATH_SEPARATOR_S, 1, status);
        }
    } else if(idx >= 0) {
        char buf[256];
        int32_t len = T_CString_integerToString(buf, idx, 10);
        ures_appendResPath(resB, buf, len, status);
        if(resB->fResPath[resB->fResPathLen-1] != RES_PATH_SEPARATOR) {
            ures_appendResPath(resB, RES_PATH_SEPARATOR_S, 1, status);
        }
    }
    /* Make sure that Purify doesn't complain about uninitialized memory copies. */
    {
        int32_t usedLen = ((resB->fResBuf == resB->fResPath) ? resB->fResPathLen : 0);
        uprv_memset(resB->fResBuf + usedLen, 0, sizeof(resB->fResBuf) - usedLen);
    }

    resB->fVersion = NULL;
    resB->fRes = r;
    /*resB->fParent = parent->fRes;*/
    uprv_memmove(&resB->fResData, rdata, sizeof(ResourceData));
    resB->fSize = res_countArrayItems(&(resB->fResData), resB->fRes);
    return resB;
}